

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O2

void helicsMessageResize(HelicsMessage message,int newSize,HelicsError *err)

{
  Message *pMVar1;
  
  pMVar1 = getMessageObj(message,err);
  if (pMVar1 != (Message *)0x0) {
    helics::SmallBuffer::resize(&pMVar1->data,(long)newSize);
  }
  return;
}

Assistant:

void helicsMessageResize(HelicsMessage message, int newSize, HelicsError* err)
{
    auto* mess = getMessageObj(message, err);
    if (mess == nullptr) {
        return;
    }
    try {
        mess->data.resize(newSize);
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}